

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::fixRedefinedSchema
          (TraverseSchema *this,DOMElement *elem,SchemaInfo *redefinedSchemaInfo,
          XMLCh *redefineChildComponentName,XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  XMLBuffer *newTypeName;
  SchemaInfo *redefinedSchemaInfo_00;
  XMLStringPool *pXVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  DOMNode *parent;
  undefined4 extraout_var;
  XMLCh *pXVar5;
  DOMNode *node;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  parent = &XUtil::getFirstChildElement(&redefinedSchemaInfo->fSchemaRootElement->super_DOMNode)->
            super_DOMNode;
  this->fSchemaInfo = redefinedSchemaInfo;
  do {
    if (parent == (DOMNode *)0x0) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x7d,redefineChildTypeName,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      return;
    }
    iVar3 = (*parent->_vptr_DOMNode[0x18])(parent);
    bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar3),redefineChildComponentName);
    if (bVar2) {
      pXVar5 = getElementAttValue(this,(DOMElement *)parent,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                  NCName);
      bVar2 = XMLString::equals(pXVar5,redefineChildTypeName);
      if (bVar2) {
        getRedefineNewTypeName(this,pXVar5,redefineNameCounter,&this->fBuffer);
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        (*parent->_vptr_DOMNode[0x2c])(parent,SchemaSymbols::fgATT_NAME);
        return;
      }
    }
    else {
      bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar3),
                                (XMLCh *)SchemaSymbols::fgELT_REDEFINE);
      if (bVar2) {
        for (node = &XUtil::getFirstChildElement(parent)->super_DOMNode; node != (DOMNode *)0x0;
            node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
          iVar3 = (*node->_vptr_DOMNode[0x18])(node);
          bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar3),
                                    redefineChildComponentName);
          if (bVar2) {
            pXVar5 = getElementAttValue(this,(DOMElement *)node,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                        NCName);
            bVar2 = XMLString::equals(pXVar5,redefineChildTypeName);
            if (bVar2) {
              bVar2 = openRedefinedSchema(this,(DOMElement *)parent);
              if (!bVar2) {
                SchemaInfo::addFailedRedefine(redefinedSchemaInfo,(DOMElement *)parent);
                return;
              }
              redefinedSchemaInfo_00 = this->fSchemaInfo;
              bVar2 = validateRedefineNameChange
                                (this,(DOMElement *)node,redefineChildComponentName,
                                 redefineChildTypeName,redefineNameCounter + 1,redefinedSchemaInfo);
              if (bVar2) {
                fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo_00,
                                   redefineChildComponentName,redefineChildTypeName,
                                   redefineNameCounter + 1);
                newTypeName = &this->fBuffer;
                getRedefineNewTypeName(this,pXVar5,redefineNameCounter,newTypeName);
                pXVar1 = this->fStringPool;
                (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
                uVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1);
                iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])
                                  (pXVar1,(ulong)uVar4);
                pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
                (*node->_vptr_DOMNode[0x2c])(node,SchemaSymbols::fgATT_NAME,pXVar5);
                XMLBuffer::set(newTypeName,this->fTargetNSURIString);
                XMLBuffer::append(newTypeName,L',');
              }
              else {
                fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo_00,
                                   redefineChildComponentName,redefineChildTypeName,
                                   redefineNameCounter);
                SchemaInfo::addFailedRedefine(redefinedSchemaInfo,(DOMElement *)node);
                XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
                XMLBuffer::append(&this->fBuffer,L',');
              }
              XMLBuffer::append(&this->fBuffer,pXVar5);
              pXVar1 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
              bVar2 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                                (this->fRedefineComponents,redefineChildComponentName,iVar3);
              if (bVar2) {
                return;
              }
              RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                        (this->fRedefineComponents,redefineChildComponentName,iVar3,(char16_t *)0x0)
              ;
              return;
            }
          }
        }
      }
    }
    parent = &XUtil::getNextSiblingElement(parent)->super_DOMNode;
  } while( true );
}

Assistant:

void TraverseSchema::fixRedefinedSchema(const DOMElement* const elem,
                                        SchemaInfo* const redefinedSchemaInfo,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {

    bool foundIt = false;
    DOMElement* child = XUtil::getFirstChildElement(redefinedSchemaInfo->getRoot());

    restoreSchemaInfo(redefinedSchemaInfo);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, redefineChildComponentName)) {

            const XMLCh* infoItemName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

            if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                continue;
            }
            else { // found it!

                // now we have to do the renaming...
                foundIt = true;
                getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                child->setAttribute(SchemaSymbols::fgATT_NAME, fBuffer.getRawBuffer());
                break;
            }
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) { // need to search the redefine decl...

            for (DOMElement* redefChild = XUtil::getFirstChildElement(child);
                 redefChild != 0;
                 redefChild = XUtil::getNextSiblingElement(redefChild)) {

                const XMLCh* redefName = redefChild->getLocalName();

                if (XMLString::equals(redefName, redefineChildComponentName)) {

                    const XMLCh* infoItemName = getElementAttValue(redefChild, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

                    if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                        continue;
                    }
                    else { // found it!

                        if (!openRedefinedSchema(child)) {

                            redefinedSchemaInfo->addFailedRedefine(child);
                            return;
                        }

                        foundIt = true;

                        SchemaInfo* reRedefinedSchemaInfo = fSchemaInfo;

                        if (validateRedefineNameChange(redefChild, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1, redefinedSchemaInfo)) {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1);

                            // now we have to do the renaming...
                            getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                            const XMLCh* newInfoItemName = fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
                            redefChild->setAttribute(SchemaSymbols::fgATT_NAME, newInfoItemName);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(newInfoItemName);
                        }
                        else {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
                            redefinedSchemaInfo->addFailedRedefine(redefChild);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(infoItemName);
                        }

                        unsigned int infoItemNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());

                        if (!fRedefineComponents->containsKey(redefineChildComponentName, infoItemNameId)) {
                            fRedefineComponents->put((void*) redefineChildComponentName, infoItemNameId, 0);
                        }

                        break;
                    }
                }
            } //for

            if (foundIt) {
                break;
            }
        }
    } //for

    if(!foundIt) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_DeclarationNotFound, redefineChildTypeName);
    }
}